

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O0

void i2cp_begin(i2cp_state *state)

{
  uint32_t uVar1;
  byte *in_RDI;
  uint32_t sz;
  i2cp_stringbuf str;
  uint8_t b;
  uint32_t in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined7 in_stack_fffffffffffffef8;
  uint8_t in_stack_fffffffffffffeff;
  i2cp_state *in_stack_ffffffffffffff00;
  
  if ((*in_RDI & 1) == 0) {
    i2cp_write_msg((uint8_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffeec,(i2cp_state *)0x106b62);
    i2cp_putstring((i2cp_stringbuf *)in_stack_ffffffffffffff00,
                   (char *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
    uVar1 = i2cp_buflen((i2cp_stringbuf *)&stack0xfffffffffffffef7);
    htobe16buf((void *)CONCAT44(in_stack_fffffffffffffef4,uVar1),
               (uint16_t)(in_stack_fffffffffffffeec >> 0x10));
    i2cp_queue_send(in_stack_ffffffffffffff00,in_stack_fffffffffffffeff,
                    (uint8_t *)CONCAT44(in_stack_fffffffffffffef4,uVar1 + 2),
                    in_stack_fffffffffffffeec);
    i2cp_flush_write((i2cp_state *)0x106bc7);
    *in_RDI = 1;
  }
  return;
}

Assistant:

void i2cp_begin(struct i2cp_state * state)
{
  if(!state->sentinit)
  {
    // protocol byte
    uint8_t b = 0x2a;
    i2cp_write_msg(&b, 1, state);

    // get date messagee
    struct i2cp_stringbuf str;
    i2cp_putstring(&str, I2CP_VERSION);
    uint32_t sz = i2cp_buflen(&str);
    // empty mapping
    htobe16buf(str.data + sz, 0);
    sz += 2;
    i2cp_queue_send(state, GETDATE, str.data, sz);
    i2cp_flush_write(state);
    state->sentinit = true;
  }
}